

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

timer_id_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
schedule_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
               *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause,
              duration period)

{
  pointer ptVar1;
  undefined8 in_stack_00000008;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  mbox_t *mbox_local;
  message_ref_t *msg_local;
  type_index *type_wrapper_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  duration period_local;
  duration pause_local;
  timer_id_t *timer;
  
  lock._M_device = (mutex_type *)pause.__r;
  std::lock_guard<std::mutex>::lock_guard(&local_48,(mutex_type *)(type_wrapper + 2));
  ptVar1 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
           operator->((unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
                       *)(type_wrapper + 0x24));
  (*ptVar1->_vptr_timer_manager_t[4])
            (this,ptVar1,msg,lock._M_device,mbox,period.__r,in_stack_00000008);
  wakeup_if_waiting((main_thread_sync_objects_t *)(type_wrapper + 2));
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)this;
}

Assistant:

so_5::timer_id_t
env_infrastructure_t< ACTIVITY_TRACKER >::schedule_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause,
	std::chrono::steady_clock::duration period )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		auto timer = m_timer_manager->schedule(
				type_wrapper,
				mbox,
				msg,
				pause,
				period );

		wakeup_if_waiting( m_sync_objects );

		return timer;
	}